

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O1

int __thiscall
glslang::TIntermediate::addUsedOffsets(TIntermediate *this,int binding,int offset,int numOffsets)

{
  pointer *ppTVar1;
  pointer pTVar2;
  iterator __position;
  int iVar3;
  int *piVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  TOffsetRange range;
  TOffsetRange local_30;
  
  iVar3 = numOffsets + offset + -1;
  local_30.binding.last = binding;
  local_30.binding.start = binding;
  local_30.offset.last = iVar3;
  local_30.offset.start = offset;
  pTVar2 = (this->usedAtomics).
           super__Vector_base<glslang::TOffsetRange,_std::allocator<glslang::TOffsetRange>_>._M_impl
           .super__Vector_impl_data._M_start;
  __position._M_current =
       (this->usedAtomics).
       super__Vector_base<glslang::TOffsetRange,_std::allocator<glslang::TOffsetRange>_>._M_impl.
       super__Vector_impl_data._M_finish;
  lVar5 = (long)__position._M_current - (long)pTVar2;
  bVar8 = lVar5 != 0;
  if (bVar8) {
    uVar6 = lVar5 >> 4;
    piVar4 = &(pTVar2->offset).last;
    uVar7 = 1;
    do {
      if ((((piVar4[-3] <= binding) && (binding <= piVar4[-2])) &&
          (((TRange *)(piVar4 + -1))->start <= iVar3)) && (offset <= *piVar4)) {
        if (offset < ((TRange *)(piVar4 + -1))->start) {
          offset = ((TRange *)(piVar4 + -1))->start;
        }
        break;
      }
      bVar8 = uVar7 < uVar6;
      lVar5 = (-(ulong)(uVar6 == 0) - uVar6) + uVar7;
      uVar7 = uVar7 + 1;
      piVar4 = piVar4 + 4;
    } while (lVar5 != 0);
  }
  if (!bVar8) {
    if (__position._M_current ==
        (this->usedAtomics).
        super__Vector_base<glslang::TOffsetRange,_std::allocator<glslang::TOffsetRange>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<glslang::TOffsetRange,std::allocator<glslang::TOffsetRange>>::
      _M_realloc_insert<glslang::TOffsetRange_const&>
                ((vector<glslang::TOffsetRange,std::allocator<glslang::TOffsetRange>> *)
                 &this->usedAtomics,__position,&local_30);
    }
    else {
      (__position._M_current)->binding = local_30.binding;
      (__position._M_current)->offset = local_30.offset;
      ppTVar1 = &(this->usedAtomics).
                 super__Vector_base<glslang::TOffsetRange,_std::allocator<glslang::TOffsetRange>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppTVar1 = *ppTVar1 + 1;
    }
    offset = -1;
  }
  return offset;
}

Assistant:

int TIntermediate::addUsedOffsets(int binding, int offset, int numOffsets)
{
    TRange bindingRange(binding, binding);
    TRange offsetRange(offset, offset + numOffsets - 1);
    TOffsetRange range(bindingRange, offsetRange);

    // check for collisions, except for vertex inputs on desktop
    for (size_t r = 0; r < usedAtomics.size(); ++r) {
        if (range.overlap(usedAtomics[r])) {
            // there is a collision; pick one
            return std::max(offset, usedAtomics[r].offset.start);
        }
    }

    usedAtomics.push_back(range);

    return -1; // no collision
}